

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O0

wchar_t * ON_wString::ToNumber(wchar_t *buffer,ON__UINT64 value_on_failure,ON__UINT64 *value)

{
  wchar_t c;
  bool bAcceptOrdinarySign;
  int iVar1;
  int iVar2;
  uint uVar3;
  wchar_t *pwVar4;
  bool local_6a;
  bool local_69;
  ON__UINT64 r1;
  ON__UINT64 d;
  wchar_t *s;
  ON__UINT64 r;
  bool b2;
  bool b1;
  bool b0;
  int sign;
  wchar_t c0;
  wchar_t *rc;
  ON__UINT64 u;
  ON__UINT64 *value_local;
  ON__UINT64 value_on_failure_local;
  wchar_t *buffer_local;
  
  if (value == (ON__UINT64 *)0x0) {
    buffer_local = (wchar_t *)0x0;
  }
  else {
    _sign = (wchar_t *)0x0;
    rc = (wchar_t *)value_on_failure;
    if (buffer != (wchar_t *)0x0) {
      c = *buffer;
      iVar1 = PlusOrMinusSignFromWideChar(c,true,true,true);
      value_on_failure_local = (ON__UINT64)buffer;
      if (0 < iVar1) {
        value_on_failure_local = (ON__UINT64)(buffer + 1);
      }
      bAcceptOrdinarySign = IsDecimalDigit(*(wchar_t *)value_on_failure_local,true,false,false);
      local_69 = false;
      if (!bAcceptOrdinarySign) {
        local_69 = IsDecimalDigit(*(wchar_t *)value_on_failure_local,false,true,false);
      }
      local_6a = false;
      if ((!bAcceptOrdinarySign) && (local_6a = false, local_69 == false)) {
        local_6a = IsDecimalDigit(*(wchar_t *)value_on_failure_local,false,false,true);
      }
      if ((((bAcceptOrdinarySign) || (local_69 != false)) || (local_6a != false)) &&
         (iVar2 = PlusOrMinusSignFromWideChar(c,bAcceptOrdinarySign,local_69,local_6a),
         iVar1 == iVar2)) {
        s = (wchar_t *)0x0;
        d = value_on_failure_local;
        while( true ) {
          uVar3 = DecimalDigitFromWideChar(*(wchar_t *)d,bAcceptOrdinarySign,local_69,local_6a,10);
          if (9 < (ulong)uVar3) break;
          pwVar4 = (wchar_t *)((long)s * 10 + (ulong)uVar3);
          if (pwVar4 < s) goto LAB_0085c65e;
          d = d + 4;
          s = pwVar4;
        }
        rc = s;
        _sign = (wchar_t *)d;
      }
    }
LAB_0085c65e:
    *value = (ON__UINT64)rc;
    buffer_local = _sign;
  }
  return buffer_local;
}

Assistant:

const wchar_t* ON_wString::ToNumber(
  const wchar_t* buffer,
  ON__UINT64 value_on_failure,
  ON__UINT64* value
  )
{
  if (nullptr == value)
    return nullptr;

  ON__UINT64 u = value_on_failure;
  const wchar_t* rc = nullptr;

  if (nullptr != buffer)
  {
    const wchar_t c0 = buffer[0];
    const int sign = ON_wString::PlusOrMinusSignFromWideChar(c0,true,true,true);
    if (sign > 0)
      ++buffer; // c0 is some type of plus sign.

    const bool b0 = ON_wString::IsDecimalDigit(buffer[0], true, false, false);
    const bool b1 = false == b0 && ON_wString::IsDecimalDigit(buffer[0], false, true, false);
    const bool b2 = false == b0 && false == b1 && ON_wString::IsDecimalDigit(buffer[0], false, false, true);

    if ((b0 || b1 || b2) && sign == ON_wString::PlusOrMinusSignFromWideChar(c0, b0, b1, b2))
    {
      ON__UINT64 r = 0;
      for (const wchar_t* s = buffer;/*empty test*/; s++)
      {
        const ON__UINT64 d = (ON__UINT64)ON_wString::DecimalDigitFromWideChar(*s, b0, b1, b2, 10);
        if (d < 10LLU)
        {
          const ON__UINT64 r1 = r * 10LLU + d;
          if (r1 < r)
          {
            // overflow
            break;
          }
          r = r1;
          continue;
        }
        u = r;
        rc = s;
        break;
      }
    }
  }

  *value = u;
  return rc;
}